

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_msmblur.h
# Opt level: O2

NodeRecordMB4D * __thiscall
embree::sse2::BVHBuilderMSMBlur::
BuilderT<embree::NodeRefPtr<4>,_embree::sse2::RecalculatePrimRef<embree::Instance>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Set,_embree::sse2::CreateMSMBlurLeaf<4,_embree::Instance,_embree::InstancePrimitive>,_embree::Scene::BuildProgressMonitorInterface>
::createLargeLeaf(NodeRecordMB4D *__return_storage_ptr__,
                 BuilderT<embree::NodeRefPtr<4>,_embree::sse2::RecalculatePrimRef<embree::Instance>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Set,_embree::sse2::CreateMSMBlurLeaf<4,_embree::Instance,_embree::InstancePrimitive>,_embree::Scene::BuildProgressMonitorInterface>
                 *this,BuildRecord *in,CachedAllocator alloc)

{
  size_t *psVar1;
  atomic<unsigned_long> *paVar2;
  char *pcVar3;
  size_t end;
  SharedVector<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
  *pSVar4;
  PrimRefMB *pPVar5;
  MemoryMonitorInterface *pMVar6;
  mvector<embree::PrimRefMB> *pmVar7;
  code *pcVar8;
  ThreadLocal2 *pTVar9;
  Instance *this_00;
  BBox1f BVar10;
  BBox1f BVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  SharedVector<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
  *pSVar14;
  SharedVector<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
  *pSVar15;
  char cVar16;
  mvector<PrimRefMB> *prims;
  long lVar17;
  size_t sVar18;
  __uniq_ptr_data<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>,_true,_true>
  _Var19;
  void *pvVar20;
  undefined8 *puVar21;
  runtime_error *prVar22;
  long lVar23;
  vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
  *pvVar24;
  size_t sVar25;
  float *pfVar26;
  unsigned_long uVar27;
  range<unsigned_long> *prVar28;
  BuildRecord *this_01;
  Split *pSVar29;
  unsigned_long uVar30;
  char *pcVar31;
  ulong uVar32;
  size_t sVar33;
  ulong uVar34;
  size_t i_3;
  SetMB *this_02;
  LocalChildListSplit *in_00;
  ulong uVar35;
  BBox1f *pBVar36;
  size_t i_5;
  Split *pSVar37;
  uint *puVar38;
  bool bVar39;
  bool bVar40;
  uint uVar41;
  uint uVar42;
  undefined8 uVar43;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar44;
  undefined8 uVar45;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar46;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  float fVar50;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  float fVar54;
  float fVar55;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  undefined1 local_1e18 [16];
  undefined8 uStack_1e10;
  unique_ptr<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
  new_vector;
  undefined1 local_1df8 [16];
  float local_1de8;
  float fStack_1de4;
  ulong local_1dd8;
  BBox1f time_range1;
  BBox1f time_range0;
  undefined1 local_1db8 [16];
  _Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
  local_1d98;
  PrimRefVector lprims;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1d88;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1d78;
  PrimInfoMB left;
  anon_class_1_0_00000001 reduction;
  vbool vSplitMask;
  anon_class_1_0_00000001 reduction2;
  undefined1 local_1c48 [16];
  task_group_context context_2;
  vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
  *local_1b98;
  PrimInfoMB right;
  anon_class_24_3_c5d13451 isLeft;
  unsigned_long local_1a58;
  unsigned_long local_1a50;
  BuildRecordSplit local_1a28;
  vint vSplitPos;
  BuildRecordSplit current;
  LocalChildListSplit children;
  NodeRecordMB4D values [16];
  
  children.children.items[0].super_BuildRecord.depth = in->depth;
  if ((this->cfg).maxDepth < children.children.items[0].super_BuildRecord.depth) {
    puVar21 = (undefined8 *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string((string *)&children,"depth limit reached",(allocator *)values);
    *puVar21 = &PTR__rtcore_error_021d38e0;
    *(undefined4 *)(puVar21 + 1) = 1;
    std::__cxx11::string::string((string *)(puVar21 + 2),(string *)&children);
    __cxa_throw(puVar21,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
  }
  SetMB::SetMB(&children.children.items[0].super_BuildRecord.prims,&in->prims);
  findFallback((Split *)values,this,&in->prims);
  BuildRecord::BuildRecord(&current.super_BuildRecord,(BuildRecord *)&children);
  current.split.sah = (float)(undefined4)values[0].ref.ptr;
  current.split.dim = values[0].ref.ptr._4_4_;
  current.split.mapping.num = values[0].lbounds.bounds0.lower.field_0._0_8_;
  current.split.mapping.ofs.field_0._0_8_ = values[0].lbounds.bounds0.upper.field_0._0_8_;
  current.split.mapping.ofs.field_0._8_8_ = values[0].lbounds.bounds0.upper.field_0._8_8_;
  current.split.mapping.scale.field_0._0_8_ = values[0].lbounds.bounds1.lower.field_0._0_8_;
  current.split.mapping.scale.field_0._8_8_ = values[0].lbounds.bounds1.lower.field_0._8_8_;
  uVar30 = current.super_BuildRecord.prims.super_PrimInfoMB.object_range._begin;
  if (current.super_BuildRecord.depth == 1) {
    if (current.super_BuildRecord.prims.super_PrimInfoMB.object_range._end ==
        current.super_BuildRecord.prims.super_PrimInfoMB.object_range._begin) {
      bVar39 = false;
      uVar30 = current.super_BuildRecord.prims.super_PrimInfoMB.object_range._end;
    }
    else {
      lVar17 = current.super_BuildRecord.prims.super_PrimInfoMB.object_range._begin * 0x50 + 0x44;
      fVar50 = INFINITY;
      fVar55 = -INFINITY;
      for (uVar27 = current.super_BuildRecord.prims.super_PrimInfoMB.object_range._begin;
          uVar27 < current.super_BuildRecord.prims.super_PrimInfoMB.object_range._end;
          uVar27 = uVar27 + 1) {
        fVar54 = *(float *)((long)(current.super_BuildRecord.prims.prims)->items + lVar17 + -4);
        if (fVar54 <= fVar50) {
          fVar50 = fVar54;
        }
        fVar54 = *(float *)((long)&((current.super_BuildRecord.prims.prims)->items->lbounds).bounds0
                                   .lower.field_0 + lVar17);
        if (fVar54 <= fVar55) {
          fVar54 = fVar55;
        }
        lVar17 = lVar17 + 0x50;
        fVar55 = fVar54;
      }
      bVar39 = current.super_BuildRecord.prims.super_PrimInfoMB.time_range.lower < fVar50 ||
               fVar55 < current.super_BuildRecord.prims.super_PrimInfoMB.time_range.upper;
    }
  }
  else {
    bVar39 = false;
  }
  uVar35 = current.super_BuildRecord.prims.super_PrimInfoMB.object_range._end - uVar30;
  if (((uVar35 <= (this->cfg).maxLeafSize) && ((uint)values[0]._12_4_ < 2)) && (!bVar39)) {
    local_1a28.super_BuildRecord.depth = uVar35 * 0x10;
    pTVar9 = (alloc.talloc1)->parent;
    if (alloc.alloc != (pTVar9->alloc)._M_b._M_p) {
      values[0]._8_1_ = 1;
      values[0].ref.ptr = (size_t)pTVar9;
      MutexSys::lock(&pTVar9->mutex);
      if ((pTVar9->alloc)._M_b._M_p != (__pointer_type)0x0) {
        LOCK();
        paVar2 = &((pTVar9->alloc)._M_b._M_p)->bytesUsed;
        (paVar2->super___atomic_base<unsigned_long>)._M_i =
             (paVar2->super___atomic_base<unsigned_long>)._M_i +
             (pTVar9->alloc1).bytesUsed + (pTVar9->alloc0).bytesUsed;
        UNLOCK();
        LOCK();
        paVar2 = &((pTVar9->alloc)._M_b._M_p)->bytesFree;
        (paVar2->super___atomic_base<unsigned_long>)._M_i =
             (paVar2->super___atomic_base<unsigned_long>)._M_i +
             (((pTVar9->alloc0).end + (pTVar9->alloc1).end) -
             ((pTVar9->alloc0).cur + (pTVar9->alloc1).cur));
        UNLOCK();
        LOCK();
        paVar2 = &((pTVar9->alloc)._M_b._M_p)->bytesWasted;
        (paVar2->super___atomic_base<unsigned_long>)._M_i =
             (paVar2->super___atomic_base<unsigned_long>)._M_i +
             (pTVar9->alloc1).bytesWasted + (pTVar9->alloc0).bytesWasted;
        UNLOCK();
      }
      (pTVar9->alloc0).bytesUsed = 0;
      (pTVar9->alloc0).bytesWasted = 0;
      (pTVar9->alloc0).end = 0;
      (pTVar9->alloc0).allocBlockSize = 0;
      (pTVar9->alloc0).ptr = (char *)0x0;
      (pTVar9->alloc0).cur = 0;
      if (alloc.alloc == (FastAllocator *)0x0) {
        (pTVar9->alloc1).bytesUsed = 0;
        (pTVar9->alloc1).bytesWasted = 0;
        (pTVar9->alloc1).end = 0;
        (pTVar9->alloc1).allocBlockSize = 0;
        (pTVar9->alloc1).ptr = (char *)0x0;
        (pTVar9->alloc1).cur = 0;
      }
      else {
        (pTVar9->alloc0).allocBlockSize = (alloc.alloc)->defaultBlockSize;
        (pTVar9->alloc1).ptr = (char *)0x0;
        (pTVar9->alloc1).cur = 0;
        (pTVar9->alloc1).end = 0;
        (pTVar9->alloc1).allocBlockSize = 0;
        (pTVar9->alloc1).bytesUsed = 0;
        (pTVar9->alloc1).bytesWasted = 0;
        (pTVar9->alloc1).allocBlockSize = (alloc.alloc)->defaultBlockSize;
      }
      LOCK();
      (pTVar9->alloc)._M_b._M_p = alloc.alloc;
      UNLOCK();
      children.children.items[0].super_BuildRecord.depth =
           (size_t)&FastAllocator::s_thread_local_allocators_lock;
      children.children.items[0].super_BuildRecord._8_1_ = 1;
      context_2.my_cpu_ctl_env = (uint64_t)pTVar9;
      MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
      std::
      vector<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
      ::push_back(&(alloc.alloc)->thread_local_allocators,(value_type *)&context_2);
      Lock<embree::MutexSys>::~Lock((Lock<embree::MutexSys> *)&children);
      Lock<embree::MutexSys>::~Lock((Lock<embree::MutexSys> *)values);
    }
    sVar33 = local_1a28.super_BuildRecord.depth;
    (alloc.talloc1)->bytesUsed = local_1a28.super_BuildRecord.depth + (alloc.talloc1)->bytesUsed;
    sVar25 = (alloc.talloc1)->cur;
    uVar34 = (ulong)(-(int)sVar25 & 0xf);
    uVar32 = local_1a28.super_BuildRecord.depth + uVar34 + sVar25;
    (alloc.talloc1)->cur = uVar32;
    if ((alloc.talloc1)->end < uVar32) {
      (alloc.talloc1)->cur = sVar25;
      uVar34 = (alloc.talloc1)->allocBlockSize;
      if (local_1a28.super_BuildRecord.depth * 4 < uVar34 ||
          local_1a28.super_BuildRecord.depth * 4 - uVar34 == 0) {
        children.children.items[0].super_BuildRecord.depth = uVar34;
        pcVar31 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&children);
        (alloc.talloc1)->ptr = pcVar31;
        sVar25 = ((alloc.talloc1)->end - (alloc.talloc1)->cur) + (alloc.talloc1)->bytesWasted;
        (alloc.talloc1)->bytesWasted = sVar25;
        (alloc.talloc1)->end = children.children.items[0].super_BuildRecord.depth;
        (alloc.talloc1)->cur = sVar33;
        if (children.children.items[0].super_BuildRecord.depth < sVar33) {
          (alloc.talloc1)->cur = 0;
          children.children.items[0].super_BuildRecord.depth = (alloc.talloc1)->allocBlockSize;
          pcVar31 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&children);
          (alloc.talloc1)->ptr = pcVar31;
          sVar25 = ((alloc.talloc1)->end - (alloc.talloc1)->cur) + (alloc.talloc1)->bytesWasted;
          (alloc.talloc1)->bytesWasted = sVar25;
          (alloc.talloc1)->end = children.children.items[0].super_BuildRecord.depth;
          (alloc.talloc1)->cur = sVar33;
          if (children.children.items[0].super_BuildRecord.depth < sVar33) {
            (alloc.talloc1)->cur = 0;
            pcVar31 = (char *)0x0;
            goto LAB_004e381b;
          }
        }
        (alloc.talloc1)->bytesWasted = sVar25;
      }
      else {
        pcVar31 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&local_1a28);
      }
    }
    else {
      (alloc.talloc1)->bytesWasted = (alloc.talloc1)->bytesWasted + uVar34;
      pcVar31 = (alloc.talloc1)->ptr + (uVar32 - local_1a28.super_BuildRecord.depth);
    }
LAB_004e381b:
    uVar34 = 7;
    if (uVar35 < 7) {
      uVar34 = uVar35;
    }
    uVar32 = uVar30 * 0x50 | 0xc;
    puVar38 = (uint *)(pcVar31 + 8);
    aVar44 = _DAT_01f45a40;
    aVar46 = _DAT_01f45a30;
    local_1d78 = _DAT_01f45a30;
    local_1d88 = _DAT_01f45a40;
    while (bVar39 = uVar35 != 0, uVar35 = uVar35 - 1, bVar39) {
      uVar41 = *(uint *)((long)&((current.super_BuildRecord.prims.prims)->items->lbounds).bounds0.
                                lower.field_0 + uVar32);
      this_00 = (Instance *)(((this->createLeaf).bvh)->scene->geometries).items[uVar41].ptr;
      *(Instance **)(puVar38 + -2) = this_00;
      *puVar38 = uVar41;
      Instance::nonlinearBounds
                ((LBBox3fa *)&children,this_00,(BBox1f *)values,
                 &(this_00->super_Geometry).time_range,(this_00->super_Geometry).fnumTimeSegments);
      auVar12[8] = children.children.items[0].super_BuildRecord._8_1_;
      auVar12._0_8_ = children.children.items[0].super_BuildRecord.depth;
      auVar12._9_7_ = children.children.items[0].super_BuildRecord._9_7_;
      aVar46.m128 = (__m128)minps(aVar46.m128,auVar12);
      aVar44.m128 = (__m128)maxps(aVar44.m128,
                                  children.children.items[0].super_BuildRecord.prims.
                                  super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
                                  geomBounds.bounds0.lower.field_0);
      local_1d78.m128 =
           (__m128)minps(local_1d78.m128,
                         children.children.items[0].super_BuildRecord.prims.super_PrimInfoMB.
                         super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.
                         field_0);
      local_1d88.m128 =
           (__m128)maxps(local_1d88.m128,
                         children.children.items[0].super_BuildRecord.prims.super_PrimInfoMB.
                         super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.
                         field_0);
      uVar32 = uVar32 + 0x50;
      puVar38 = puVar38 + 4;
    }
    (__return_storage_ptr__->ref).ptr = uVar34 | (ulong)pcVar31 | 8;
    (__return_storage_ptr__->lbounds).bounds0.lower.field_0 = aVar46;
    (__return_storage_ptr__->lbounds).bounds0.upper.field_0 = aVar44;
    (__return_storage_ptr__->lbounds).bounds1.lower.field_0 = local_1d78;
    (__return_storage_ptr__->lbounds).bounds1.upper.field_0 = local_1d88;
    BVar10.upper = current.super_BuildRecord.prims.super_PrimInfoMB.time_range.upper;
    BVar10.lower = current.super_BuildRecord.prims.super_PrimInfoMB.time_range.lower;
    __return_storage_ptr__->dt = BVar10;
    return __return_storage_ptr__;
  }
  array_t<embree::sse2::BVHBuilderMSMBlur::BuildRecordSplit,_16UL>::array_t(&children.children);
  children.numChildren = 1;
  local_1dd8 = 1;
  children.numSharedPrimVecs = 1;
  BuildRecordSplit::operator=((BuildRecordSplit *)&children,&current);
  children.sharedPrimVecs.items[0].prims = current.super_BuildRecord.prims.prims;
  children.sharedPrimVecs.items[0].refCount = 2;
  children.primvecs.items[0] = children.sharedPrimVecs.items;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = local_1db8._0_8_;
  local_1db8 = auVar13 << 0x40;
  local_1d78._8_8_ = 0x7f8000007f800000;
  local_1d78._0_8_ = 0x7f8000007f800000;
  local_1d88._8_8_ = 0xff800000ff800000;
  local_1d88._0_8_ = 0xff800000ff800000;
  do {
    auVar13 = local_1db8;
    prVar28 = &children.children.items[0].super_BuildRecord.prims.super_PrimInfoMB.object_range;
    uVar35 = 0;
    sVar25 = 0xffffffffffffffff;
    for (sVar33 = 0; children.numChildren != sVar33; sVar33 = sVar33 + 1) {
      uVar34 = prVar28->_end - prVar28->_begin;
      if ((((this->cfg).maxLeafSize < uVar34) || (1 < *(uint *)((long)(prVar28 + 4) + 0xc))) ||
         (bVar39)) {
        if (uVar35 < uVar34) {
          sVar25 = sVar33;
          uVar35 = uVar34;
        }
        bVar39 = false;
      }
      prVar28 = prVar28 + 0xf;
    }
    if (sVar25 == 0xffffffffffffffff) break;
    lVar17 = sVar25 * 0xf0;
    this_01 = &children.children.items[sVar25].super_BuildRecord;
    context_2.my_cpu_ctl_env = current.super_BuildRecord.depth + 1;
    local_1a28.split.sah = INFINITY;
    local_1a28.split.dim = -1;
    local_1a28.split.field_2 = (anon_union_4_2_620955e9_for_BinSplit<32UL>_3)0x0;
    local_1a28.split.data = 0;
    uVar41 = *(uint *)((long)values + lVar17 + -0x10d4);
    local_1a28.super_BuildRecord.depth = context_2.my_cpu_ctl_env;
    if (3 < uVar41) goto LAB_004e269e;
    this_02 = &children.children.items[sVar25].super_BuildRecord.prims;
    switch(uVar41) {
    case 0:
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_ =
           0x7f8000007f800000;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._8_8_ =
           0x7f8000007f800000;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0._0_8_ =
           0xff800000ff800000;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0._8_8_ =
           0xff800000ff800000;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0._0_8_ =
           0x7f8000007f800000;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0._8_8_ =
           0x7f8000007f800000;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0._0_8_ =
           0xff800000ff800000;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0._8_8_ =
           0xff800000ff800000;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0._0_8_ =
           0x7f8000007f800000;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0._8_8_ =
           0x7f8000007f800000;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0._0_8_ =
           0xff800000ff800000;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0._8_8_ =
           0xff800000ff800000;
      left.num_time_segments = 0;
      left.max_num_time_segments = 0;
      left.object_range._begin = 0;
      left.object_range._end = 0;
      left.max_time_range.lower = 0.0;
      left.max_time_range.upper = 1.0;
      left.time_range.lower = 1.0;
      left.time_range.upper = 0.0;
      isLeft.split = (Split *)((long)values + lVar17 + -0x10e0);
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_ =
           0x7f8000007f800000;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._8_8_ =
           0x7f8000007f800000;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0._0_8_ =
           0xff800000ff800000;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0._8_8_ =
           0xff800000ff800000;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0._0_8_ =
           0x7f8000007f800000;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0._8_8_ =
           0x7f8000007f800000;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0._0_8_ =
           0xff800000ff800000;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0._8_8_ =
           0xff800000ff800000;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0._0_8_ =
           0x7f8000007f800000;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0._8_8_ =
           0x7f8000007f800000;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0._0_8_ =
           0xff800000ff800000;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0._8_8_ =
           0xff800000ff800000;
      right.num_time_segments = 0;
      right.max_num_time_segments = 0;
      right.object_range._begin = 0;
      right.object_range._end = 0;
      right.max_time_range.lower = 0.0;
      right.max_time_range.upper = 1.0;
      right.time_range.lower = 1.0;
      right.time_range.upper = 0.0;
      sVar33 = children.children.items[sVar25].super_BuildRecord.prims.super_PrimInfoMB.object_range
               ._begin;
      end = children.children.items[sVar25].super_BuildRecord.prims.super_PrimInfoMB.object_range.
            _end;
      vSplitPos.field_0.i[1] = *(undefined4 *)((long)values + lVar17 + -0x10d8);
      vSplitPos.field_0.i[0] = vSplitPos.field_0.i[1];
      vSplitPos.field_0.i[3] = vSplitPos.field_0.i[1];
      vSplitPos.field_0.i[2] = vSplitPos.field_0.i[1];
      lVar23 = (long)(1 << (*(byte *)((long)values + lVar17 + -0x10dc) & 0x1f)) * 0x10;
      vSplitMask.field_0._0_8_ = *(undefined8 *)(mm_lookupmask_ps + lVar23);
      vSplitMask.field_0._8_8_ = *(undefined8 *)(mm_lookupmask_ps + lVar23 + 8);
      isLeft.vSplitPos = &vSplitPos;
      isLeft.vSplitMask = &vSplitMask;
      sVar18 = parallel_partitioning<embree::PrimRefMB,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::EmptyTy,embree::sse2::HeuristicArrayBinningMB<embree::PrimRefMB,32ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimRefMB_const&)_1_,embree::sse2::HeuristicArrayBinningMB<embree::PrimRefMB,32ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>&,embree::PrimRefMB_const&)_1_,embree::sse2::HeuristicArrayBinningMB<embree::PrimRefMB,32ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)_1_>
                         (*(PrimRefMB **)(*(long *)((long)values + lVar17 + -0x10f0) + 0x20),sVar33,
                          end,(EmptyTy *)local_1c48,&left,&right,&isLeft,&reduction,&reduction2,0x80
                          ,0xc00);
      local_1b98 = *(vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
                     **)((long)values + lVar17 + -0x10f0);
      PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::PrimInfoMBT
                ((PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&context_2.field_6,&left);
      pvVar24 = *(vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
                  **)((long)values + lVar17 + -0x10f0);
      uVar43 = *(undefined8 *)((long)values + lVar17 + -0x10f8);
      context_2.padding._40_8_ = sVar33;
      context_2.padding._48_8_ = sVar18;
      PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::PrimInfoMBT
                (&local_1a28.super_BuildRecord.prims.super_PrimInfoMB,&right);
      local_1de8 = (float)uVar43;
      fStack_1de4 = (float)((ulong)uVar43 >> 0x20);
      local_1a28.super_BuildRecord.prims.super_PrimInfoMB.time_range.lower =
           (float)(~-(uint)(local_1a28.super_BuildRecord.prims.super_PrimInfoMB.time_range.lower <
                           local_1de8) &
                   (uint)local_1a28.super_BuildRecord.prims.super_PrimInfoMB.time_range.lower |
                  (uint)local_1de8 &
                  -(uint)(local_1a28.super_BuildRecord.prims.super_PrimInfoMB.time_range.lower <
                         local_1de8));
      local_1a28.super_BuildRecord.prims.super_PrimInfoMB.time_range.upper =
           (float)(~-(uint)(local_1a28.super_BuildRecord.prims.super_PrimInfoMB.time_range.upper <
                           fStack_1de4) & (uint)fStack_1de4 |
                  (uint)local_1a28.super_BuildRecord.prims.super_PrimInfoMB.time_range.upper &
                  -(uint)(local_1a28.super_BuildRecord.prims.super_PrimInfoMB.time_range.upper <
                         fStack_1de4));
      local_1a28.super_BuildRecord.prims.super_PrimInfoMB.object_range._begin = sVar18;
      local_1a28.super_BuildRecord.prims.super_PrimInfoMB.object_range._end = end;
      local_1a28.super_BuildRecord.prims.prims = pvVar24;
      break;
    case 1:
      SetMB::deterministic_order(this_02);
      splitFallback(this,this_02,(SetMB *)&context_2.field_6,&local_1a28.super_BuildRecord.prims);
      break;
    case 2:
      time_range1.lower = *(float *)((long)values + lVar17 + -0x10d8);
      time_range0.lower = *(float *)((long)values + lVar17 + -0x10f8);
      time_range1.upper = *(float *)((long)values + lVar17 + -0x10f4);
      pmVar7 = *(mvector<embree::PrimRefMB> **)((long)values + lVar17 + -0x10f0);
      time_range0.upper = time_range1.lower;
      _Var19.
      super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
      .
      super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
            )::operator_new(0x28);
      pMVar6 = (this->heuristicTemporalSplit).device;
      *(long *)((long)_Var19.
                      super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                      .
                      super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                      ._M_head_impl + 0x20) = 0;
      pSVar29 = (Split *)children.children.items[sVar25].super_BuildRecord.prims.super_PrimInfoMB.
                         object_range._end;
      uVar30 = children.children.items[sVar25].super_BuildRecord.prims.super_PrimInfoMB.object_range
               ._begin;
      *(MemoryMonitorInterface **)
       _Var19.
       super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
       .
       super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
       ._M_head_impl = pMVar6;
      *(undefined1 *)
       ((long)_Var19.
              super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
              .
              super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
              ._M_head_impl + 8) = 0;
      *(long *)((long)_Var19.
                      super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                      .
                      super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                      ._M_head_impl + 0x10) = 0;
      *(long *)((long)_Var19.
                      super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                      .
                      super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                      ._M_head_impl + 0x18) = 0;
      lVar17 = (long)pSVar29 - uVar30;
      pSVar37 = pSVar29;
      if (lVar17 != 0) {
        uVar35 = lVar17 * 0x50;
        (**pMVar6->_vptr_MemoryMonitorInterface)(pMVar6,uVar35,0);
        if (uVar35 < 0x1c00000) {
          pvVar20 = alignedMalloc(uVar35,0x10);
        }
        else {
          pvVar20 = os_malloc(uVar35,(bool *)((long)_Var19.
                                                  super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                                                  ._M_head_impl + 8));
        }
        *(void **)((long)_Var19.
                         super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                         .
                         super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                         ._M_head_impl + 0x20) = pvVar20;
        *(long *)((long)_Var19.
                        super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                        .
                        super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                        ._M_head_impl + 0x10) = lVar17;
        *(long *)((long)_Var19.
                        super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                        .
                        super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                        ._M_head_impl + 0x18) = lVar17;
        pSVar29 = (Split *)children.children.items[sVar25].super_BuildRecord.prims.super_PrimInfoMB.
                           object_range._begin;
        pSVar37 = (Split *)children.children.items[sVar25].super_BuildRecord.prims.super_PrimInfoMB.
                           object_range._end;
      }
      vSplitMask.field_0._8_8_ = &time_range0;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_ =
           0x7f8000007f800000;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._8_8_ =
           0x7f8000007f800000;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0._0_8_ =
           0xff800000ff800000;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0._8_8_ =
           0xff800000ff800000;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0._0_8_ =
           0x7f8000007f800000;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0._8_8_ =
           0x7f8000007f800000;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0._0_8_ =
           0xff800000ff800000;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0._8_8_ =
           0xff800000ff800000;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0._0_8_ =
           0x7f8000007f800000;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0._8_8_ =
           0x7f8000007f800000;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0._0_8_ =
           0xff800000ff800000;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0._8_8_ =
           0xff800000ff800000;
      left.num_time_segments = 0;
      left.max_num_time_segments = 0;
      left.object_range._begin = 0;
      left.object_range._end = 0;
      left.max_time_range.lower = 0.0;
      left.max_time_range.upper = 1.0;
      left.time_range.lower = 1.0;
      left.time_range.upper = 0.0;
      new_vector._M_t.
      super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
      .
      super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>,_true,_true>
            )(__uniq_ptr_data<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>,_true,_true>
              )_Var19.
               super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
               .
               super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
               ._M_head_impl;
      lprims = (PrimRefVector)
               _Var19.
               super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
               .
               super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
               ._M_head_impl;
      vSplitMask.field_0._0_8_ = pmVar7;
      if ((ulong)((long)pSVar37 - (long)pSVar29) < 0xc00) {
        isLeft.split = pSVar29;
        isLeft.vSplitPos = (vint *)pSVar37;
        ::anon_func::anon_class_40_5_808acc65::operator()
                  (&right,(anon_class_40_5_808acc65 *)&vSplitMask,(range<unsigned_long> *)&isLeft);
      }
      else {
        tbb::detail::d1::task_group_context::task_group_context
                  ((task_group_context *)&isLeft,(context_traits)0x4,CUSTOM_CTX);
        _reduction = PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2;
        vSplitPos.field_0.v[0] = (longlong)pSVar37;
        vSplitPos.field_0.v[1] = (longlong)pSVar29;
        tbb::detail::d1::
        parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::parallel_reduce<unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::sse2::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::sse2::RecalculatePrimRef<embree::Instance>,2ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>(unsigned_long,unsigned_long,unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::sse2::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::sse2::RecalculatePrimRef<embree::Instance>,2ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_1_const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(const&)(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&))::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>
                  (&right,(d1 *)&vSplitPos,(blocked_range<unsigned_long> *)&left,
                   (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&reduction,
                   (anon_class_16_2_ed117de8_conflict29 *)
                   PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2,
                   (_func_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr
                    *)&isLeft,(task_group_context *)this_01);
        cVar16 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&isLeft);
        if (cVar16 != '\0') {
          prVar22 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar22,"task cancelled");
          __cxa_throw(prVar22,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        tbb::detail::d1::task_group_context::~task_group_context((task_group_context *)&isLeft);
      }
      uVar30 = children.children.items[sVar25].super_BuildRecord.prims.super_PrimInfoMB.object_range
               ._end - children.children.items[sVar25].super_BuildRecord.prims.super_PrimInfoMB.
                       object_range._begin;
      if (right.object_range._end - right.object_range._begin != uVar30) {
        left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_ =
             &time_range0;
        right.object_range._end =
             parallel_filter<embree::PrimRefMB,unsigned_long,embree::sse2::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::sse2::RecalculatePrimRef<embree::Instance>,2ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimRefMB_const&)_1_>
                       (lprims->items,0,uVar30,0x400,(anon_class_8_1_41ce32a5 *)&left);
      }
      fVar50 = time_range0.upper;
      fVar55 = time_range0.lower;
      PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::PrimInfoMBT
                ((PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&left,&right);
      uVar41 = -(uint)(left.time_range.lower < fVar55);
      uVar42 = -(uint)(left.time_range.upper < fVar50);
      uVar35 = CONCAT44(~uVar42 & (uint)fVar50,~uVar41 & (uint)left.time_range.lower) |
               CONCAT44((uint)left.time_range.upper & uVar42,(uint)fVar55 & uVar41);
      left.time_range.lower = (float)uVar35;
      left.time_range.upper = (float)(uVar35 >> 0x20);
      SetMB::operator=((SetMB *)&context_2.field_6,(SetMB *)&left);
      uVar30 = children.children.items[sVar25].super_BuildRecord.prims.super_PrimInfoMB.object_range
               ._begin;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_ =
           0x7f8000007f800000;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._8_8_ =
           0x7f8000007f800000;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0._0_8_ =
           0xff800000ff800000;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0._8_8_ =
           0xff800000ff800000;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0._0_8_ =
           0x7f8000007f800000;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0._8_8_ =
           0x7f8000007f800000;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0._0_8_ =
           0xff800000ff800000;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0._8_8_ =
           0xff800000ff800000;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0._0_8_ =
           0x7f8000007f800000;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.field_0._8_8_ =
           0x7f8000007f800000;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0._0_8_ =
           0xff800000ff800000;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.field_0._8_8_ =
           0xff800000ff800000;
      left.num_time_segments = 0;
      left.max_num_time_segments = 0;
      left.object_range._begin = 0;
      left.object_range._end = 0;
      left.max_time_range.lower = 0.0;
      left.max_time_range.upper = 1.0;
      left.time_range.lower = 1.0;
      left.time_range.upper = 0.0;
      pcVar8 = (code *)children.children.items[sVar25].super_BuildRecord.prims.super_PrimInfoMB.
                       object_range._end;
      _reduction2 = pmVar7;
      if ((long)pcVar8 - uVar30 < 0xc00) {
        vSplitPos.field_0.v[0] = uVar30;
        vSplitPos.field_0.v[1] = (longlong)pcVar8;
        ::anon_func::anon_class_24_3_35f68c7c::operator()
                  ((PrimInfoMB *)&isLeft,(anon_class_24_3_35f68c7c *)&reduction2,
                   (range<unsigned_long> *)&vSplitPos);
      }
      else {
        tbb::detail::d1::task_group_context::task_group_context
                  ((task_group_context *)&vSplitPos,(context_traits)0x4,CUSTOM_CTX);
        local_1c48._0_8_ = PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2;
        local_1c48._8_8_ = &reduction2;
        _reduction = pcVar8;
        tbb::detail::d1::
        parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::parallel_reduce<unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::sse2::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::sse2::RecalculatePrimRef<embree::Instance>,2ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_2_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>(unsigned_long,unsigned_long,unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::sse2::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::sse2::RecalculatePrimRef<embree::Instance>,2ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_2_const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(const&)(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&))::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>
                  ((PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&isLeft,(d1 *)&reduction,
                   (blocked_range<unsigned_long> *)&left,
                   (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)local_1c48,
                   (anon_class_16_2_ed117de8_conflict30 *)
                   PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2,
                   (_func_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr
                    *)&vSplitPos,(task_group_context *)this_01);
        cVar16 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&vSplitPos);
        if (cVar16 != '\0') {
          prVar22 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar22,"task cancelled");
          __cxa_throw(prVar22,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        tbb::detail::d1::task_group_context::~task_group_context((task_group_context *)&vSplitPos);
      }
      lVar17 = local_1a50 - local_1a58;
      local_1a58 = children.children.items[sVar25].super_BuildRecord.prims.super_PrimInfoMB.
                   object_range._begin;
      local_1a50 = lVar17 + local_1a58;
      uVar30 = children.children.items[sVar25].super_BuildRecord.prims.super_PrimInfoMB.object_range
               ._end;
      if (lVar17 != uVar30 - local_1a58) {
        left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_ =
             &time_range1;
        local_1a50 = parallel_filter<embree::PrimRefMB,unsigned_long,embree::sse2::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::sse2::RecalculatePrimRef<embree::Instance>,2ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimRefMB_const&)_2_>
                               (pmVar7->items,local_1a58,uVar30,0x400,
                                (anon_class_8_1_41ce32a6 *)&left);
      }
      fVar50 = time_range1.upper;
      fVar55 = time_range1.lower;
      PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::PrimInfoMBT
                ((PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&left,
                 (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&isLeft);
      uVar41 = -(uint)(left.time_range.lower < fVar55);
      uVar42 = -(uint)(left.time_range.upper < fVar50);
      left.time_range.lower = (float)(~uVar41 & (uint)left.time_range.lower | (uint)fVar55 & uVar41)
      ;
      left.time_range.upper = (float)(~uVar42 & (uint)fVar50 | (uint)left.time_range.upper & uVar42)
      ;
      SetMB::operator=(&local_1a28.super_BuildRecord.prims,(SetMB *)&left);
      bVar40 = (__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                )new_vector._M_t.
                 super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                 .
                 super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
                 ._M_head_impl !=
               (__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                )0x0;
      goto LAB_004e26ae;
    case 3:
      SetMB::deterministic_order(this_02);
      splitByGeometry(this,this_02,(SetMB *)&context_2.field_6,&local_1a28.super_BuildRecord.prims);
    }
LAB_004e269e:
    new_vector._M_t.
    super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
    .
    super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>,_true,_true>
          )(__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
            )0x0;
    bVar40 = false;
LAB_004e26ae:
    findFallback((Split *)&left,this,(SetMB *)&context_2.field_6);
    findFallback((Split *)&left,this,&local_1a28.super_BuildRecord.prims);
    sVar33 = children.numSharedPrimVecs;
    local_1a28.split.sah =
         (float)left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0
                ._0_4_;
    local_1a28.split.dim =
         left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._4_4_;
    local_1a28.split.field_2 =
         (anon_union_4_2_620955e9_for_BinSplit<32UL>_3)
         left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._8_4_;
    local_1a28.split.data =
         left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._12_4_
    ;
    local_1a28.split.mapping.num =
         left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0._0_8_;
    local_1a28.split.mapping.ofs.field_0._0_8_ =
         left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0._0_8_;
    local_1a28.split.mapping.ofs.field_0._8_8_ =
         left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0._8_8_;
    local_1a28.split.mapping.scale.field_0._0_8_ =
         left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0._0_8_;
    local_1a28.split.mapping.scale.field_0._8_8_ =
         left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0._8_8_;
    local_1d98._M_head_impl =
         (vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
          *)new_vector._M_t.
            super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
            .
            super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
            ._M_head_impl;
    new_vector._M_t.
    super___uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
    .
    super__Head_base<0UL,_embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>,_true,_true>
          )(__uniq_ptr_impl<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
            )0x0;
    pSVar4 = children.primvecs.items[sVar25];
    if (local_1b98 == pSVar4->prims) {
      pSVar4->refCount = pSVar4->refCount + 1;
      pvVar24 = local_1b98;
    }
    else {
      pSVar14 = children.sharedPrimVecs.items + children.numSharedPrimVecs;
      pSVar15 = children.sharedPrimVecs.items + children.numSharedPrimVecs;
      children.numSharedPrimVecs = children.numSharedPrimVecs + 1;
      pSVar15->prims = local_1b98;
      children.sharedPrimVecs.items[sVar33].refCount = 1;
      children.primvecs.items[sVar25] =
           (SharedVector<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
            *)&pSVar14->prims;
      pvVar24 = pSVar4->prims;
    }
    sVar25 = children.numSharedPrimVecs;
    if (local_1a28.super_BuildRecord.prims.prims == pvVar24) {
      children.primvecs.items[children.numChildren] = pSVar4;
      sVar25 = pSVar4->refCount;
      pSVar4->refCount = sVar25 + 1;
    }
    else {
      pSVar14 = children.sharedPrimVecs.items + children.numSharedPrimVecs;
      pSVar15 = children.sharedPrimVecs.items + children.numSharedPrimVecs;
      children.numSharedPrimVecs = children.numSharedPrimVecs + 1;
      pSVar15->prims = local_1a28.super_BuildRecord.prims.prims;
      children.sharedPrimVecs.items[sVar25].refCount = 1;
      children.primvecs.items[children.numChildren] =
           (SharedVector<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
            *)&pSVar14->prims;
      sVar25 = pSVar4->refCount - 1;
    }
    pSVar4->refCount = sVar25;
    if (sVar25 == 0) {
      pvVar24 = pSVar4->prims;
      if (pvVar24 !=
          (vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
           *)0x0) {
        sVar25 = pvVar24->size_alloced;
        pPVar5 = pvVar24->items;
        if (pPVar5 != (PrimRefMB *)0x0) {
          if (sVar25 * 0x50 < 0x1c00000) {
            alignedFree(pPVar5);
          }
          else {
            os_free(pPVar5,sVar25 * 0x50,(pvVar24->alloc).hugepages);
          }
        }
        if (sVar25 != 0) {
          pMVar6 = (pvVar24->alloc).device;
          (**pMVar6->_vptr_MemoryMonitorInterface)(pMVar6,sVar25 * -0x50,1);
        }
        pvVar24->size_active = 0;
        pvVar24->size_alloced = 0;
        pvVar24->items = (PrimRefMB *)0x0;
      }
      ::operator_delete(pvVar24);
    }
    local_1d98._M_head_impl =
         (vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
          *)0x0;
    BuildRecordSplit::operator=((BuildRecordSplit *)this_01,(BuildRecordSplit *)&context_2);
    BuildRecordSplit::operator=
              ((BuildRecordSplit *)&children.children.items[children.numChildren].super_BuildRecord,
               &local_1a28);
    local_1db8._1_7_ = local_1db8._1_7_;
    local_1db8[0] = local_1db8[0] | bVar40;
    local_1db8._8_8_ = auVar13._8_8_;
    children.numChildren = children.numChildren + 1;
    std::
    unique_ptr<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
    ::~unique_ptr((unique_ptr<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
                   *)&local_1d98);
    std::
    unique_ptr<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
    ::~unique_ptr(&new_vector);
  } while (children.numChildren < (this->cfg).branchingFactor);
  in_00 = &children;
  pfVar26 = &children.children.items[0].super_BuildRecord.prims.super_PrimInfoMB.time_range.upper;
  sVar25 = children.numChildren;
  while( true ) {
    auVar13 = local_1db8;
    bVar39 = sVar25 == 0;
    sVar25 = sVar25 - 1;
    if (bVar39) break;
    local_1db8._1_7_ = local_1db8._1_7_;
    local_1db8[0] =
         local_1db8[0] |
         -(*pfVar26 < (in->prims).super_PrimInfoMB.time_range.upper ||
          (in->prims).super_PrimInfoMB.time_range.lower < ((BBox1f *)(pfVar26 + -1))->lower);
    local_1db8._8_8_ = auVar13._8_8_;
    pfVar26 = pfVar26 + 0x3c;
  }
  if ((local_1db8 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_ =
         0xe0;
    pTVar9 = (alloc.talloc0)->parent;
    if (alloc.alloc != (pTVar9->alloc)._M_b._M_p) {
      local_1a28.super_BuildRecord._8_1_ = 1;
      local_1a28.super_BuildRecord.depth = (size_t)pTVar9;
      MutexSys::lock(&pTVar9->mutex);
      if ((pTVar9->alloc)._M_b._M_p != (__pointer_type)0x0) {
        LOCK();
        paVar2 = &((pTVar9->alloc)._M_b._M_p)->bytesUsed;
        (paVar2->super___atomic_base<unsigned_long>)._M_i =
             (paVar2->super___atomic_base<unsigned_long>)._M_i +
             (pTVar9->alloc1).bytesUsed + (pTVar9->alloc0).bytesUsed;
        UNLOCK();
        LOCK();
        paVar2 = &((pTVar9->alloc)._M_b._M_p)->bytesFree;
        (paVar2->super___atomic_base<unsigned_long>)._M_i =
             (paVar2->super___atomic_base<unsigned_long>)._M_i +
             (((pTVar9->alloc0).end + (pTVar9->alloc1).end) -
             ((pTVar9->alloc0).cur + (pTVar9->alloc1).cur));
        UNLOCK();
        LOCK();
        paVar2 = &((pTVar9->alloc)._M_b._M_p)->bytesWasted;
        (paVar2->super___atomic_base<unsigned_long>)._M_i =
             (paVar2->super___atomic_base<unsigned_long>)._M_i +
             (pTVar9->alloc1).bytesWasted + (pTVar9->alloc0).bytesWasted;
        UNLOCK();
      }
      (pTVar9->alloc0).bytesUsed = 0;
      (pTVar9->alloc0).bytesWasted = 0;
      (pTVar9->alloc0).end = 0;
      (pTVar9->alloc0).allocBlockSize = 0;
      (pTVar9->alloc0).ptr = (char *)0x0;
      (pTVar9->alloc0).cur = 0;
      if (alloc.alloc == (FastAllocator *)0x0) {
        (pTVar9->alloc1).bytesUsed = 0;
        (pTVar9->alloc1).bytesWasted = 0;
        (pTVar9->alloc1).end = 0;
        (pTVar9->alloc1).allocBlockSize = 0;
        (pTVar9->alloc1).ptr = (char *)0x0;
        (pTVar9->alloc1).cur = 0;
      }
      else {
        (pTVar9->alloc0).allocBlockSize = (alloc.alloc)->defaultBlockSize;
        (pTVar9->alloc1).ptr = (char *)0x0;
        (pTVar9->alloc1).cur = 0;
        (pTVar9->alloc1).end = 0;
        (pTVar9->alloc1).allocBlockSize = 0;
        (pTVar9->alloc1).bytesUsed = 0;
        (pTVar9->alloc1).bytesWasted = 0;
        (pTVar9->alloc1).allocBlockSize = (alloc.alloc)->defaultBlockSize;
      }
      LOCK();
      (pTVar9->alloc)._M_b._M_p = alloc.alloc;
      UNLOCK();
      context_2.my_cpu_ctl_env = (uint64_t)&FastAllocator::s_thread_local_allocators_lock;
      context_2.my_cancellation_requested.super___atomic_base<unsigned_int>._M_i._0_1_ = 1;
      left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_ =
           pTVar9;
      MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
      std::
      vector<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
      ::push_back(&(alloc.alloc)->thread_local_allocators,(value_type *)&left);
      Lock<embree::MutexSys>::~Lock((Lock<embree::MutexSys> *)&context_2);
      Lock<embree::MutexSys>::~Lock((Lock<embree::MutexSys> *)&local_1a28);
    }
    (alloc.talloc0)->bytesUsed =
         (alloc.talloc0)->bytesUsed +
         right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_
    ;
    sVar25 = (alloc.talloc0)->cur;
    uVar35 = (ulong)(-(int)sVar25 & 0xf);
    uVar34 = sVar25 + right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                      field_0._0_8_ + uVar35;
    (alloc.talloc0)->cur = uVar34;
    if ((alloc.talloc0)->end < uVar34) {
      (alloc.talloc0)->cur = sVar25;
      if ((alloc.talloc0)->allocBlockSize <
          (ulong)(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                  field_0._0_8_ << 2)) {
        pcVar31 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&right);
      }
      else {
        context_2.my_cpu_ctl_env = (alloc.talloc0)->allocBlockSize;
        pcVar31 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&context_2);
        (alloc.talloc0)->ptr = pcVar31;
        sVar25 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
        (alloc.talloc0)->bytesWasted = sVar25;
        (alloc.talloc0)->end = context_2.my_cpu_ctl_env;
        (alloc.talloc0)->cur =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
             _0_8_;
        if (context_2.my_cpu_ctl_env <
            (ulong)right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                   field_0._0_8_) {
          (alloc.talloc0)->cur = 0;
          context_2.my_cpu_ctl_env = (alloc.talloc0)->allocBlockSize;
          pcVar31 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&context_2);
          (alloc.talloc0)->ptr = pcVar31;
          sVar25 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
          (alloc.talloc0)->bytesWasted = sVar25;
          (alloc.talloc0)->end = context_2.my_cpu_ctl_env;
          (alloc.talloc0)->cur =
               right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0
               ._0_8_;
          if (context_2.my_cpu_ctl_env <
              (ulong)right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                     field_0._0_8_) {
            (alloc.talloc0)->cur = 0;
            pcVar31 = (char *)0x0;
            goto LAB_004e33ff;
          }
        }
        (alloc.talloc0)->bytesWasted = sVar25;
      }
    }
    else {
      (alloc.talloc0)->bytesWasted = (alloc.talloc0)->bytesWasted + uVar35;
      pcVar31 = (alloc.talloc0)->ptr +
                (uVar34 - right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.
                          lower.field_0._0_8_);
    }
LAB_004e33ff:
    pcVar31[0x60] = '\0';
    pcVar31[0x61] = '\0';
    pcVar31[0x62] = -0x80;
    pcVar31[99] = '\x7f';
    pcVar31[100] = '\0';
    pcVar31[0x65] = '\0';
    pcVar31[0x66] = -0x80;
    pcVar31[0x67] = '\x7f';
    pcVar31[0x68] = '\0';
    pcVar31[0x69] = '\0';
    pcVar31[0x6a] = -0x80;
    pcVar31[0x6b] = '\x7f';
    pcVar31[0x6c] = '\0';
    pcVar31[0x6d] = '\0';
    pcVar31[0x6e] = -0x80;
    pcVar31[0x6f] = '\x7f';
    pcVar31[0x40] = '\0';
    pcVar31[0x41] = '\0';
    pcVar31[0x42] = -0x80;
    pcVar31[0x43] = '\x7f';
    pcVar31[0x44] = '\0';
    pcVar31[0x45] = '\0';
    pcVar31[0x46] = -0x80;
    pcVar31[0x47] = '\x7f';
    pcVar31[0x48] = '\0';
    pcVar31[0x49] = '\0';
    pcVar31[0x4a] = -0x80;
    pcVar31[0x4b] = '\x7f';
    pcVar31[0x4c] = '\0';
    pcVar31[0x4d] = '\0';
    pcVar31[0x4e] = -0x80;
    pcVar31[0x4f] = '\x7f';
    pcVar31[0x20] = '\0';
    pcVar31[0x21] = '\0';
    pcVar31[0x22] = -0x80;
    pcVar31[0x23] = '\x7f';
    pcVar31[0x24] = '\0';
    pcVar31[0x25] = '\0';
    pcVar31[0x26] = -0x80;
    pcVar31[0x27] = '\x7f';
    pcVar31[0x28] = '\0';
    pcVar31[0x29] = '\0';
    pcVar31[0x2a] = -0x80;
    pcVar31[0x2b] = '\x7f';
    pcVar31[0x2c] = '\0';
    pcVar31[0x2d] = '\0';
    pcVar31[0x2e] = -0x80;
    pcVar31[0x2f] = '\x7f';
    pcVar31[0x70] = '\0';
    pcVar31[0x71] = '\0';
    pcVar31[0x72] = -0x80;
    pcVar31[0x73] = -1;
    pcVar31[0x74] = '\0';
    pcVar31[0x75] = '\0';
    pcVar31[0x76] = -0x80;
    pcVar31[0x77] = -1;
    pcVar31[0x78] = '\0';
    pcVar31[0x79] = '\0';
    pcVar31[0x7a] = -0x80;
    pcVar31[0x7b] = -1;
    pcVar31[0x7c] = '\0';
    pcVar31[0x7d] = '\0';
    pcVar31[0x7e] = -0x80;
    pcVar31[0x7f] = -1;
    pcVar31[0x50] = '\0';
    pcVar31[0x51] = '\0';
    pcVar31[0x52] = -0x80;
    pcVar31[0x53] = -1;
    pcVar31[0x54] = '\0';
    pcVar31[0x55] = '\0';
    pcVar31[0x56] = -0x80;
    pcVar31[0x57] = -1;
    pcVar31[0x58] = '\0';
    pcVar31[0x59] = '\0';
    pcVar31[0x5a] = -0x80;
    pcVar31[0x5b] = -1;
    pcVar31[0x5c] = '\0';
    pcVar31[0x5d] = '\0';
    pcVar31[0x5e] = -0x80;
    pcVar31[0x5f] = -1;
    pcVar31[0x30] = '\0';
    pcVar31[0x31] = '\0';
    pcVar31[0x32] = -0x80;
    pcVar31[0x33] = -1;
    pcVar31[0x34] = '\0';
    pcVar31[0x35] = '\0';
    pcVar31[0x36] = -0x80;
    pcVar31[0x37] = -1;
    pcVar31[0x38] = '\0';
    pcVar31[0x39] = '\0';
    pcVar31[0x3a] = -0x80;
    pcVar31[0x3b] = -1;
    pcVar31[0x3c] = '\0';
    pcVar31[0x3d] = '\0';
    pcVar31[0x3e] = -0x80;
    pcVar31[0x3f] = -1;
    pcVar31[0x80] = '\0';
    pcVar31[0x81] = '\0';
    pcVar31[0x82] = '\0';
    pcVar31[0x83] = '\0';
    pcVar31[0x84] = '\0';
    pcVar31[0x85] = '\0';
    pcVar31[0x86] = '\0';
    pcVar31[0x87] = '\0';
    pcVar31[0x88] = '\0';
    pcVar31[0x89] = '\0';
    pcVar31[0x8a] = '\0';
    pcVar31[0x8b] = '\0';
    pcVar31[0x8c] = '\0';
    pcVar31[0x8d] = '\0';
    pcVar31[0x8e] = '\0';
    pcVar31[0x8f] = '\0';
    pcVar31[0x90] = '\0';
    pcVar31[0x91] = '\0';
    pcVar31[0x92] = '\0';
    pcVar31[0x93] = '\0';
    pcVar31[0x94] = '\0';
    pcVar31[0x95] = '\0';
    pcVar31[0x96] = '\0';
    pcVar31[0x97] = '\0';
    pcVar31[0x98] = '\0';
    pcVar31[0x99] = '\0';
    pcVar31[0x9a] = '\0';
    pcVar31[0x9b] = '\0';
    pcVar31[0x9c] = '\0';
    pcVar31[0x9d] = '\0';
    pcVar31[0x9e] = '\0';
    pcVar31[0x9f] = '\0';
    pcVar31[0xa0] = '\0';
    pcVar31[0xa1] = '\0';
    pcVar31[0xa2] = '\0';
    pcVar31[0xa3] = '\0';
    pcVar31[0xa4] = '\0';
    pcVar31[0xa5] = '\0';
    pcVar31[0xa6] = '\0';
    pcVar31[0xa7] = '\0';
    pcVar31[0xa8] = '\0';
    pcVar31[0xa9] = '\0';
    pcVar31[0xaa] = '\0';
    pcVar31[0xab] = '\0';
    pcVar31[0xac] = '\0';
    pcVar31[0xad] = '\0';
    pcVar31[0xae] = '\0';
    pcVar31[0xaf] = '\0';
    pcVar31[0xb0] = '\0';
    pcVar31[0xb1] = '\0';
    pcVar31[0xb2] = '\0';
    pcVar31[0xb3] = '\0';
    pcVar31[0xb4] = '\0';
    pcVar31[0xb5] = '\0';
    pcVar31[0xb6] = '\0';
    pcVar31[0xb7] = '\0';
    pcVar31[0xb8] = '\0';
    pcVar31[0xb9] = '\0';
    pcVar31[0xba] = '\0';
    pcVar31[0xbb] = '\0';
    pcVar31[0xbc] = '\0';
    pcVar31[0xbd] = '\0';
    pcVar31[0xbe] = '\0';
    pcVar31[0xbf] = '\0';
    pcVar31[0xc0] = '\0';
    pcVar31[0xc1] = '\0';
    pcVar31[0xc2] = '\0';
    pcVar31[0xc3] = '\0';
    pcVar31[0xc4] = '\0';
    pcVar31[0xc5] = '\0';
    pcVar31[0xc6] = '\0';
    pcVar31[199] = '\0';
    pcVar31[200] = '\0';
    pcVar31[0xc9] = '\0';
    pcVar31[0xca] = '\0';
    pcVar31[0xcb] = '\0';
    pcVar31[0xcc] = '\0';
    pcVar31[0xcd] = '\0';
    pcVar31[0xce] = '\0';
    pcVar31[0xcf] = '\0';
    pcVar31[0xd0] = '\0';
    pcVar31[0xd1] = '\0';
    pcVar31[0xd2] = '\0';
    pcVar31[0xd3] = '\0';
    pcVar31[0xd4] = '\0';
    pcVar31[0xd5] = '\0';
    pcVar31[0xd6] = '\0';
    pcVar31[0xd7] = '\0';
    pcVar31[0xd8] = '\0';
    pcVar31[0xd9] = '\0';
    pcVar31[0xda] = '\0';
    pcVar31[0xdb] = '\0';
    pcVar31[0xdc] = '\0';
    pcVar31[0xdd] = '\0';
    pcVar31[0xde] = '\0';
    pcVar31[0xdf] = '\0';
    for (lVar17 = 0; lVar17 != 4; lVar17 = lVar17 + 1) {
      pcVar3 = pcVar31 + lVar17 * 8;
      pcVar3[0] = '\b';
      pcVar3[1] = '\0';
      pcVar3[2] = '\0';
      pcVar3[3] = '\0';
      pcVar3[4] = '\0';
      pcVar3[5] = '\0';
      pcVar3[6] = '\0';
      pcVar3[7] = '\0';
    }
    goto LAB_004e3467;
  }
  right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_ =
       0x100;
  pTVar9 = (alloc.talloc0)->parent;
  if (alloc.alloc != (pTVar9->alloc)._M_b._M_p) {
    local_1a28.super_BuildRecord._8_1_ = 1;
    local_1a28.super_BuildRecord.depth = (size_t)pTVar9;
    MutexSys::lock(&pTVar9->mutex);
    if ((pTVar9->alloc)._M_b._M_p != (__pointer_type)0x0) {
      LOCK();
      paVar2 = &((pTVar9->alloc)._M_b._M_p)->bytesUsed;
      (paVar2->super___atomic_base<unsigned_long>)._M_i =
           (paVar2->super___atomic_base<unsigned_long>)._M_i +
           (pTVar9->alloc1).bytesUsed + (pTVar9->alloc0).bytesUsed;
      UNLOCK();
      LOCK();
      paVar2 = &((pTVar9->alloc)._M_b._M_p)->bytesFree;
      (paVar2->super___atomic_base<unsigned_long>)._M_i =
           (paVar2->super___atomic_base<unsigned_long>)._M_i +
           (((pTVar9->alloc0).end + (pTVar9->alloc1).end) -
           ((pTVar9->alloc0).cur + (pTVar9->alloc1).cur));
      UNLOCK();
      LOCK();
      paVar2 = &((pTVar9->alloc)._M_b._M_p)->bytesWasted;
      (paVar2->super___atomic_base<unsigned_long>)._M_i =
           (paVar2->super___atomic_base<unsigned_long>)._M_i +
           (pTVar9->alloc1).bytesWasted + (pTVar9->alloc0).bytesWasted;
      UNLOCK();
    }
    (pTVar9->alloc0).bytesUsed = 0;
    (pTVar9->alloc0).bytesWasted = 0;
    (pTVar9->alloc0).end = 0;
    (pTVar9->alloc0).allocBlockSize = 0;
    (pTVar9->alloc0).ptr = (char *)0x0;
    (pTVar9->alloc0).cur = 0;
    if (alloc.alloc == (FastAllocator *)0x0) {
      (pTVar9->alloc1).bytesUsed = 0;
      (pTVar9->alloc1).bytesWasted = 0;
      (pTVar9->alloc1).end = 0;
      (pTVar9->alloc1).allocBlockSize = 0;
      (pTVar9->alloc1).ptr = (char *)0x0;
      (pTVar9->alloc1).cur = 0;
    }
    else {
      (pTVar9->alloc0).allocBlockSize = (alloc.alloc)->defaultBlockSize;
      (pTVar9->alloc1).ptr = (char *)0x0;
      (pTVar9->alloc1).cur = 0;
      (pTVar9->alloc1).end = 0;
      (pTVar9->alloc1).allocBlockSize = 0;
      (pTVar9->alloc1).bytesUsed = 0;
      (pTVar9->alloc1).bytesWasted = 0;
      (pTVar9->alloc1).allocBlockSize = (alloc.alloc)->defaultBlockSize;
    }
    LOCK();
    (pTVar9->alloc)._M_b._M_p = alloc.alloc;
    UNLOCK();
    context_2.my_cpu_ctl_env = (uint64_t)&FastAllocator::s_thread_local_allocators_lock;
    context_2.my_cancellation_requested.super___atomic_base<unsigned_int>._M_i._0_1_ = 1;
    left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_ =
         pTVar9;
    MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    std::
    vector<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
    ::push_back(&(alloc.alloc)->thread_local_allocators,(value_type *)&left);
    Lock<embree::MutexSys>::~Lock((Lock<embree::MutexSys> *)&context_2);
    Lock<embree::MutexSys>::~Lock((Lock<embree::MutexSys> *)&local_1a28);
  }
  (alloc.talloc0)->bytesUsed =
       (alloc.talloc0)->bytesUsed +
       right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_;
  sVar25 = (alloc.talloc0)->cur;
  uVar35 = (ulong)(-(int)sVar25 & 0xf);
  uVar34 = sVar25 + right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                    field_0._0_8_ + uVar35;
  (alloc.talloc0)->cur = uVar34;
  if ((alloc.talloc0)->end < uVar34) {
    (alloc.talloc0)->cur = sVar25;
    if ((alloc.talloc0)->allocBlockSize <
        (ulong)(right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                field_0._0_8_ << 2)) {
      pcVar31 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&right);
    }
    else {
      context_2.my_cpu_ctl_env = (alloc.talloc0)->allocBlockSize;
      pcVar31 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&context_2);
      (alloc.talloc0)->ptr = pcVar31;
      sVar25 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
      (alloc.talloc0)->bytesWasted = sVar25;
      (alloc.talloc0)->end = context_2.my_cpu_ctl_env;
      (alloc.talloc0)->cur =
           right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
           _0_8_;
      if (context_2.my_cpu_ctl_env <
          (ulong)right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                 field_0._0_8_) {
        (alloc.talloc0)->cur = 0;
        context_2.my_cpu_ctl_env = (alloc.talloc0)->allocBlockSize;
        pcVar31 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&context_2);
        (alloc.talloc0)->ptr = pcVar31;
        sVar25 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
        (alloc.talloc0)->bytesWasted = sVar25;
        (alloc.talloc0)->end = context_2.my_cpu_ctl_env;
        (alloc.talloc0)->cur =
             right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0.
             _0_8_;
        if (context_2.my_cpu_ctl_env <
            (ulong)right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.
                   field_0._0_8_) {
          (alloc.talloc0)->cur = 0;
          pcVar31 = (char *)0x0;
          goto LAB_004e32d8;
        }
      }
      (alloc.talloc0)->bytesWasted = sVar25;
    }
  }
  else {
    (alloc.talloc0)->bytesWasted = (alloc.talloc0)->bytesWasted + uVar35;
    pcVar31 = (alloc.talloc0)->ptr +
              (uVar34 - right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.
                        lower.field_0._0_8_);
  }
LAB_004e32d8:
  pcVar31[0xe0] = '\0';
  pcVar31[0xe1] = '\0';
  pcVar31[0xe2] = -0x80;
  pcVar31[0xe3] = '\x7f';
  pcVar31[0xe4] = '\0';
  pcVar31[0xe5] = '\0';
  pcVar31[0xe6] = -0x80;
  pcVar31[0xe7] = '\x7f';
  pcVar31[0xe8] = '\0';
  pcVar31[0xe9] = '\0';
  pcVar31[0xea] = -0x80;
  pcVar31[0xeb] = '\x7f';
  pcVar31[0xec] = '\0';
  pcVar31[0xed] = '\0';
  pcVar31[0xee] = -0x80;
  pcVar31[0xef] = '\x7f';
  pcVar31[0xf0] = '\0';
  pcVar31[0xf1] = '\0';
  pcVar31[0xf2] = -0x80;
  pcVar31[0xf3] = -1;
  pcVar31[0xf4] = '\0';
  pcVar31[0xf5] = '\0';
  pcVar31[0xf6] = -0x80;
  pcVar31[0xf7] = -1;
  pcVar31[0xf8] = '\0';
  pcVar31[0xf9] = '\0';
  pcVar31[0xfa] = -0x80;
  pcVar31[0xfb] = -1;
  pcVar31[0xfc] = '\0';
  pcVar31[0xfd] = '\0';
  pcVar31[0xfe] = -0x80;
  pcVar31[0xff] = -1;
  pcVar31[0x60] = '\0';
  pcVar31[0x61] = '\0';
  pcVar31[0x62] = -0x80;
  pcVar31[99] = '\x7f';
  pcVar31[100] = '\0';
  pcVar31[0x65] = '\0';
  pcVar31[0x66] = -0x80;
  pcVar31[0x67] = '\x7f';
  pcVar31[0x68] = '\0';
  pcVar31[0x69] = '\0';
  pcVar31[0x6a] = -0x80;
  pcVar31[0x6b] = '\x7f';
  pcVar31[0x6c] = '\0';
  pcVar31[0x6d] = '\0';
  pcVar31[0x6e] = -0x80;
  pcVar31[0x6f] = '\x7f';
  pcVar31[0x40] = '\0';
  pcVar31[0x41] = '\0';
  pcVar31[0x42] = -0x80;
  pcVar31[0x43] = '\x7f';
  pcVar31[0x44] = '\0';
  pcVar31[0x45] = '\0';
  pcVar31[0x46] = -0x80;
  pcVar31[0x47] = '\x7f';
  pcVar31[0x48] = '\0';
  pcVar31[0x49] = '\0';
  pcVar31[0x4a] = -0x80;
  pcVar31[0x4b] = '\x7f';
  pcVar31[0x4c] = '\0';
  pcVar31[0x4d] = '\0';
  pcVar31[0x4e] = -0x80;
  pcVar31[0x4f] = '\x7f';
  pcVar31[0x20] = '\0';
  pcVar31[0x21] = '\0';
  pcVar31[0x22] = -0x80;
  pcVar31[0x23] = '\x7f';
  pcVar31[0x24] = '\0';
  pcVar31[0x25] = '\0';
  pcVar31[0x26] = -0x80;
  pcVar31[0x27] = '\x7f';
  pcVar31[0x28] = '\0';
  pcVar31[0x29] = '\0';
  pcVar31[0x2a] = -0x80;
  pcVar31[0x2b] = '\x7f';
  pcVar31[0x2c] = '\0';
  pcVar31[0x2d] = '\0';
  pcVar31[0x2e] = -0x80;
  pcVar31[0x2f] = '\x7f';
  pcVar31[0x70] = '\0';
  pcVar31[0x71] = '\0';
  pcVar31[0x72] = -0x80;
  pcVar31[0x73] = -1;
  pcVar31[0x74] = '\0';
  pcVar31[0x75] = '\0';
  pcVar31[0x76] = -0x80;
  pcVar31[0x77] = -1;
  pcVar31[0x78] = '\0';
  pcVar31[0x79] = '\0';
  pcVar31[0x7a] = -0x80;
  pcVar31[0x7b] = -1;
  pcVar31[0x7c] = '\0';
  pcVar31[0x7d] = '\0';
  pcVar31[0x7e] = -0x80;
  pcVar31[0x7f] = -1;
  pcVar31[0x50] = '\0';
  pcVar31[0x51] = '\0';
  pcVar31[0x52] = -0x80;
  pcVar31[0x53] = -1;
  pcVar31[0x54] = '\0';
  pcVar31[0x55] = '\0';
  pcVar31[0x56] = -0x80;
  pcVar31[0x57] = -1;
  pcVar31[0x58] = '\0';
  pcVar31[0x59] = '\0';
  pcVar31[0x5a] = -0x80;
  pcVar31[0x5b] = -1;
  pcVar31[0x5c] = '\0';
  pcVar31[0x5d] = '\0';
  pcVar31[0x5e] = -0x80;
  pcVar31[0x5f] = -1;
  pcVar31[0x30] = '\0';
  pcVar31[0x31] = '\0';
  pcVar31[0x32] = -0x80;
  pcVar31[0x33] = -1;
  pcVar31[0x34] = '\0';
  pcVar31[0x35] = '\0';
  pcVar31[0x36] = -0x80;
  pcVar31[0x37] = -1;
  pcVar31[0x38] = '\0';
  pcVar31[0x39] = '\0';
  pcVar31[0x3a] = -0x80;
  pcVar31[0x3b] = -1;
  pcVar31[0x3c] = '\0';
  pcVar31[0x3d] = '\0';
  pcVar31[0x3e] = -0x80;
  pcVar31[0x3f] = -1;
  pcVar31[0x80] = '\0';
  pcVar31[0x81] = '\0';
  pcVar31[0x82] = '\0';
  pcVar31[0x83] = '\0';
  pcVar31[0x84] = '\0';
  pcVar31[0x85] = '\0';
  pcVar31[0x86] = '\0';
  pcVar31[0x87] = '\0';
  pcVar31[0x88] = '\0';
  pcVar31[0x89] = '\0';
  pcVar31[0x8a] = '\0';
  pcVar31[0x8b] = '\0';
  pcVar31[0x8c] = '\0';
  pcVar31[0x8d] = '\0';
  pcVar31[0x8e] = '\0';
  pcVar31[0x8f] = '\0';
  pcVar31[0x90] = '\0';
  pcVar31[0x91] = '\0';
  pcVar31[0x92] = '\0';
  pcVar31[0x93] = '\0';
  pcVar31[0x94] = '\0';
  pcVar31[0x95] = '\0';
  pcVar31[0x96] = '\0';
  pcVar31[0x97] = '\0';
  pcVar31[0x98] = '\0';
  pcVar31[0x99] = '\0';
  pcVar31[0x9a] = '\0';
  pcVar31[0x9b] = '\0';
  pcVar31[0x9c] = '\0';
  pcVar31[0x9d] = '\0';
  pcVar31[0x9e] = '\0';
  pcVar31[0x9f] = '\0';
  pcVar31[0xa0] = '\0';
  pcVar31[0xa1] = '\0';
  pcVar31[0xa2] = '\0';
  pcVar31[0xa3] = '\0';
  pcVar31[0xa4] = '\0';
  pcVar31[0xa5] = '\0';
  pcVar31[0xa6] = '\0';
  pcVar31[0xa7] = '\0';
  pcVar31[0xa8] = '\0';
  pcVar31[0xa9] = '\0';
  pcVar31[0xaa] = '\0';
  pcVar31[0xab] = '\0';
  pcVar31[0xac] = '\0';
  pcVar31[0xad] = '\0';
  pcVar31[0xae] = '\0';
  pcVar31[0xaf] = '\0';
  pcVar31[0xb0] = '\0';
  pcVar31[0xb1] = '\0';
  pcVar31[0xb2] = '\0';
  pcVar31[0xb3] = '\0';
  pcVar31[0xb4] = '\0';
  pcVar31[0xb5] = '\0';
  pcVar31[0xb6] = '\0';
  pcVar31[0xb7] = '\0';
  pcVar31[0xb8] = '\0';
  pcVar31[0xb9] = '\0';
  pcVar31[0xba] = '\0';
  pcVar31[0xbb] = '\0';
  pcVar31[0xbc] = '\0';
  pcVar31[0xbd] = '\0';
  pcVar31[0xbe] = '\0';
  pcVar31[0xbf] = '\0';
  pcVar31[0xc0] = '\0';
  pcVar31[0xc1] = '\0';
  pcVar31[0xc2] = '\0';
  pcVar31[0xc3] = '\0';
  pcVar31[0xc4] = '\0';
  pcVar31[0xc5] = '\0';
  pcVar31[0xc6] = '\0';
  pcVar31[199] = '\0';
  pcVar31[200] = '\0';
  pcVar31[0xc9] = '\0';
  pcVar31[0xca] = '\0';
  pcVar31[0xcb] = '\0';
  pcVar31[0xcc] = '\0';
  pcVar31[0xcd] = '\0';
  pcVar31[0xce] = '\0';
  pcVar31[0xcf] = '\0';
  pcVar31[0xd0] = '\0';
  pcVar31[0xd1] = '\0';
  pcVar31[0xd2] = '\0';
  pcVar31[0xd3] = '\0';
  pcVar31[0xd4] = '\0';
  pcVar31[0xd5] = '\0';
  pcVar31[0xd6] = '\0';
  pcVar31[0xd7] = '\0';
  pcVar31[0xd8] = '\0';
  pcVar31[0xd9] = '\0';
  pcVar31[0xda] = '\0';
  pcVar31[0xdb] = '\0';
  pcVar31[0xdc] = '\0';
  pcVar31[0xdd] = '\0';
  pcVar31[0xde] = '\0';
  pcVar31[0xdf] = '\0';
  local_1dd8 = 6;
  for (lVar17 = 0; lVar17 != 4; lVar17 = lVar17 + 1) {
    pcVar3 = pcVar31 + lVar17 * 8;
    pcVar3[0] = '\b';
    pcVar3[1] = '\0';
    pcVar3[2] = '\0';
    pcVar3[3] = '\0';
    pcVar3[4] = '\0';
    pcVar3[5] = '\0';
    pcVar3[6] = '\0';
    pcVar3[7] = '\0';
  }
LAB_004e3467:
  local_1dd8 = local_1dd8 | (ulong)pcVar31;
  pBVar36 = &values[0].dt;
  uStack_1e10 = 0xff800000ff800000;
  local_1e18._0_8_ = (task_group_context *)0xff800000ff800000;
  local_1df8._8_8_ = 0x7f8000007f800000;
  local_1df8._0_8_ = 0x7f8000007f800000;
  for (uVar35 = 0; auVar53 = _DAT_01f4b860, auVar13 = _DAT_01f4b850, uVar35 < children.numChildren;
      uVar35 = uVar35 + 1) {
    createLargeLeaf((NodeRecordMB4D *)&context_2,this,(BuildRecord *)in_00,alloc);
    (((NodeRecordMB4D *)(pBVar36 + -10))->ref).ptr = context_2.my_cpu_ctl_env;
    (((LBBox3fa *)(pBVar36 + -8))->bounds0).lower.field_0 =
         (anon_union_16_2_47237d3f_for_Vec3fa_0)context_2._16_16_;
    *(intrusive_list_node *)(pBVar36 + -6) = context_2.my_node;
    (((BBox<embree::Vec3fa> *)(pBVar36 + -4))->lower).field_0 =
         (anon_union_16_2_47237d3f_for_Vec3fa_0)context_2._48_16_;
    ((Vec3fa *)(pBVar36 + -2))->field_0 = (anon_union_16_2_47237d3f_for_Vec3fa_0)context_2._64_16_;
    *pBVar36 = (BBox1f)context_2.padding._8_8_;
    local_1df8 = minps(local_1df8,(undefined1  [16])context_2._16_16_);
    local_1e18 = maxps(local_1e18,(undefined1  [16])context_2.my_node);
    local_1d78.m128 = (__m128)minps(local_1d78.m128,(undefined1  [16])context_2._48_16_);
    local_1d88.m128 = (__m128)maxps(local_1d88.m128,(undefined1  [16])context_2._64_16_);
    in_00 = (LocalChildListSplit *)((in_00->children).items + 1);
    pBVar36 = pBVar36 + 0xc;
  }
  uVar35 = (ulong)pcVar31 & 0xfffffffffffffff0;
  if (((uint)local_1dd8 & 0xf) == 1) {
    pfVar26 = &values[0].dt.upper;
    for (sVar25 = 0; children.numChildren != sVar25; sVar25 = sVar25 + 1) {
      *(undefined8 *)(uVar35 + sVar25 * 8) = *(undefined8 *)(pfVar26 + -0x15);
      fVar55 = ((BBox1f *)(pfVar26 + -1))->lower;
      fVar54 = 1.0 / (*pfVar26 - fVar55);
      fVar60 = -fVar55 * fVar54;
      fVar50 = 1.0 - fVar60;
      auVar48._0_4_ = pfVar26[-0x11] * fVar50 + pfVar26[-9] * fVar60;
      auVar48._4_4_ = pfVar26[-0x10] * fVar50 + pfVar26[-8] * fVar60;
      auVar48._8_4_ = pfVar26[-0xf] * fVar50 + pfVar26[-7] * fVar60;
      auVar48._12_4_ = pfVar26[-0xe] * fVar50 + pfVar26[-6] * fVar60;
      auVar51._0_4_ = fVar50 * pfVar26[-0xd] + fVar60 * pfVar26[-5];
      auVar51._4_4_ = fVar50 * pfVar26[-0xc] + fVar60 * pfVar26[-4];
      auVar51._8_4_ = fVar50 * pfVar26[-0xb] + fVar60 * pfVar26[-3];
      auVar51._12_4_ = fVar50 * pfVar26[-10] + fVar60 * pfVar26[-2];
      fVar54 = (1.0 - fVar55) * fVar54;
      fVar55 = 1.0 - fVar54;
      auVar57._0_4_ = pfVar26[-0x11] * fVar55 + pfVar26[-9] * fVar54;
      auVar57._4_4_ = pfVar26[-0x10] * fVar55 + pfVar26[-8] * fVar54;
      auVar57._8_4_ = pfVar26[-0xf] * fVar55 + pfVar26[-7] * fVar54;
      auVar57._12_4_ = pfVar26[-0xe] * fVar55 + pfVar26[-6] * fVar54;
      auVar56._0_4_ = fVar55 * pfVar26[-0xd] + fVar54 * pfVar26[-5];
      auVar56._4_4_ = fVar55 * pfVar26[-0xc] + fVar54 * pfVar26[-4];
      auVar56._8_4_ = fVar55 * pfVar26[-0xb] + fVar54 * pfVar26[-3];
      auVar56._12_4_ = fVar55 * pfVar26[-10] + fVar54 * pfVar26[-2];
      auVar49 = minps(auVar48,auVar53);
      auVar52 = maxps(auVar51,auVar13);
      auVar47 = minps(auVar57,auVar53);
      auVar57 = maxps(auVar56,auVar13);
      fVar55 = auVar49._0_4_ - ABS(auVar49._0_4_) * 4.7683716e-07;
      fVar50 = auVar49._4_4_ - ABS(auVar49._4_4_) * 4.7683716e-07;
      fVar54 = auVar49._8_4_ - ABS(auVar49._8_4_) * 4.7683716e-07;
      fVar60 = ABS(auVar52._0_4_) * 4.7683716e-07 + auVar52._0_4_;
      fVar58 = ABS(auVar52._4_4_) * 4.7683716e-07 + auVar52._4_4_;
      fVar59 = ABS(auVar52._8_4_) * 4.7683716e-07 + auVar52._8_4_;
      *(float *)(uVar35 + 0x20 + sVar25 * 4) = fVar55;
      *(float *)(uVar35 + 0x40 + sVar25 * 4) = fVar50;
      *(float *)(uVar35 + 0x60 + sVar25 * 4) = fVar54;
      *(float *)(uVar35 + 0x30 + sVar25 * 4) = fVar60;
      *(float *)(uVar35 + 0x50 + sVar25 * 4) = fVar58;
      *(float *)(uVar35 + 0x70 + sVar25 * 4) = fVar59;
      *(float *)(uVar35 + 0x80 + sVar25 * 4) =
           (auVar47._0_4_ - ABS(auVar47._0_4_) * 4.7683716e-07) - fVar55;
      *(float *)(uVar35 + 0xa0 + sVar25 * 4) =
           (auVar47._4_4_ - ABS(auVar47._4_4_) * 4.7683716e-07) - fVar50;
      *(float *)(uVar35 + 0xc0 + sVar25 * 4) =
           (auVar47._8_4_ - ABS(auVar47._8_4_) * 4.7683716e-07) - fVar54;
      *(float *)(uVar35 + 0x90 + sVar25 * 4) =
           (ABS(auVar57._0_4_) * 4.7683716e-07 + auVar57._0_4_) - fVar60;
      *(float *)(uVar35 + 0xb0 + sVar25 * 4) =
           (ABS(auVar57._4_4_) * 4.7683716e-07 + auVar57._4_4_) - fVar58;
      *(float *)(uVar35 + 0xd0 + sVar25 * 4) =
           (ABS(auVar57._8_4_) * 4.7683716e-07 + auVar57._8_4_) - fVar59;
      pfVar26 = pfVar26 + 0x18;
    }
  }
  else {
    pfVar26 = &values[0].dt.upper;
    for (sVar25 = 0; children.numChildren != sVar25; sVar25 = sVar25 + 1) {
      *(undefined8 *)(uVar35 + sVar25 * 8) = *(undefined8 *)(pfVar26 + -0x15);
      fVar55 = *pfVar26;
      fVar50 = ((BBox1f *)(pfVar26 + -1))->lower;
      fVar60 = 1.0 / (fVar55 - fVar50);
      fVar58 = -fVar50 * fVar60;
      fVar54 = 1.0 - fVar58;
      auVar47._0_4_ = pfVar26[-0x11] * fVar54 + pfVar26[-9] * fVar58;
      auVar47._4_4_ = pfVar26[-0x10] * fVar54 + pfVar26[-8] * fVar58;
      auVar47._8_4_ = pfVar26[-0xf] * fVar54 + pfVar26[-7] * fVar58;
      auVar47._12_4_ = pfVar26[-0xe] * fVar54 + pfVar26[-6] * fVar58;
      auVar49._0_4_ = fVar54 * pfVar26[-0xd] + fVar58 * pfVar26[-5];
      auVar49._4_4_ = fVar54 * pfVar26[-0xc] + fVar58 * pfVar26[-4];
      auVar49._8_4_ = fVar54 * pfVar26[-0xb] + fVar58 * pfVar26[-3];
      auVar49._12_4_ = fVar54 * pfVar26[-10] + fVar58 * pfVar26[-2];
      fVar60 = (1.0 - fVar50) * fVar60;
      fVar54 = 1.0 - fVar60;
      auVar53._0_4_ = pfVar26[-0x11] * fVar54 + pfVar26[-9] * fVar60;
      auVar53._4_4_ = pfVar26[-0x10] * fVar54 + pfVar26[-8] * fVar60;
      auVar53._8_4_ = pfVar26[-0xf] * fVar54 + pfVar26[-7] * fVar60;
      auVar53._12_4_ = pfVar26[-0xe] * fVar54 + pfVar26[-6] * fVar60;
      auVar52._0_4_ = fVar54 * pfVar26[-0xd] + fVar60 * pfVar26[-5];
      auVar52._4_4_ = fVar54 * pfVar26[-0xc] + fVar60 * pfVar26[-4];
      auVar52._8_4_ = fVar54 * pfVar26[-0xb] + fVar60 * pfVar26[-3];
      auVar52._12_4_ = fVar54 * pfVar26[-10] + fVar60 * pfVar26[-2];
      auVar47 = minps(auVar47,_DAT_01f4b860);
      auVar49 = maxps(auVar49,auVar13);
      auVar53 = minps(auVar53,_DAT_01f4b860);
      auVar52 = maxps(auVar52,auVar13);
      fVar59 = auVar47._0_4_ - ABS(auVar47._0_4_) * 4.7683716e-07;
      fVar61 = auVar47._4_4_ - ABS(auVar47._4_4_) * 4.7683716e-07;
      fVar62 = auVar47._8_4_ - ABS(auVar47._8_4_) * 4.7683716e-07;
      fVar54 = ABS(auVar49._0_4_) * 4.7683716e-07 + auVar49._0_4_;
      fVar60 = ABS(auVar49._4_4_) * 4.7683716e-07 + auVar49._4_4_;
      fVar58 = ABS(auVar49._8_4_) * 4.7683716e-07 + auVar49._8_4_;
      *(float *)(uVar35 + 0x20 + sVar25 * 4) = fVar59;
      *(float *)(uVar35 + 0x40 + sVar25 * 4) = fVar61;
      *(float *)(uVar35 + 0x60 + sVar25 * 4) = fVar62;
      *(float *)(uVar35 + 0x30 + sVar25 * 4) = fVar54;
      *(float *)(uVar35 + 0x50 + sVar25 * 4) = fVar60;
      *(float *)(uVar35 + 0x70 + sVar25 * 4) = fVar58;
      *(float *)(uVar35 + 0x80 + sVar25 * 4) =
           (auVar53._0_4_ - ABS(auVar53._0_4_) * 4.7683716e-07) - fVar59;
      *(float *)(uVar35 + 0xa0 + sVar25 * 4) =
           (auVar53._4_4_ - ABS(auVar53._4_4_) * 4.7683716e-07) - fVar61;
      *(float *)(uVar35 + 0xc0 + sVar25 * 4) =
           (auVar53._8_4_ - ABS(auVar53._8_4_) * 4.7683716e-07) - fVar62;
      *(float *)(uVar35 + 0x90 + sVar25 * 4) =
           (ABS(auVar52._0_4_) * 4.7683716e-07 + auVar52._0_4_) - fVar54;
      *(float *)(uVar35 + 0xb0 + sVar25 * 4) =
           (ABS(auVar52._4_4_) * 4.7683716e-07 + auVar52._4_4_) - fVar60;
      *(float *)(uVar35 + 0xd0 + sVar25 * 4) =
           (ABS(auVar52._8_4_) * 4.7683716e-07 + auVar52._8_4_) - fVar58;
      *(float *)(uVar35 + 0xe0 + sVar25 * 4) = fVar50;
      *(uint *)(uVar35 + 0xf0 + sVar25 * 4) =
           ~-(uint)(fVar55 == 1.0) & (uint)fVar55 | -(uint)(fVar55 == 1.0) & 0x3f800001;
      pfVar26 = pfVar26 + 0x18;
    }
  }
  if ((local_1db8 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    (__return_storage_ptr__->ref).ptr = local_1dd8;
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds0.lower.field_0 = local_1df8._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds0.lower.field_0 + 8) =
         local_1df8._8_8_;
    *(task_group_context **)&(__return_storage_ptr__->lbounds).bounds0.upper.field_0 =
         local_1e18._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds0.upper.field_0 + 8) =
         uStack_1e10;
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds1.lower.field_0 = local_1d78._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds1.lower.field_0 + 8) =
         local_1d78._8_8_;
    uVar43 = local_1d88._0_8_;
    uVar45 = local_1d88._8_8_;
  }
  else {
    vSplitPos.field_0.v[1] = (longlong)&this->recalculatePrimRef;
    vSplitPos.field_0.v[0] = (longlong)&current.super_BuildRecord.prims;
    local_1a28.super_BuildRecord.depth = 0x7f8000007f800000;
    local_1a28.super_BuildRecord._8_8_ = 0x7f8000007f800000;
    local_1a28.super_BuildRecord.prims.super_PrimInfoMB.
    super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_ =
         0xff800000ff800000;
    local_1a28.super_BuildRecord.prims.super_PrimInfoMB.
    super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._8_8_ =
         0xff800000ff800000;
    local_1a28.super_BuildRecord.prims.super_PrimInfoMB.
    super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0._0_8_ =
         0x7f8000007f800000;
    local_1a28.super_BuildRecord.prims.super_PrimInfoMB.
    super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0._8_8_ =
         0x7f8000007f800000;
    local_1a28.super_BuildRecord.prims.super_PrimInfoMB.
    super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0._0_8_ =
         0xff800000ff800000;
    local_1a28.super_BuildRecord.prims.super_PrimInfoMB.
    super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0._8_8_ =
         0xff800000ff800000;
    if (current.super_BuildRecord.prims.super_PrimInfoMB.object_range._end -
        current.super_BuildRecord.prims.super_PrimInfoMB.object_range._begin < 0xc00) {
      context_2.my_cpu_ctl_env =
           current.super_BuildRecord.prims.super_PrimInfoMB.object_range._begin;
      context_2.my_cancellation_requested.super___atomic_base<unsigned_int>._M_i =
           (__atomic_base<unsigned_int>)
           (__atomic_base<unsigned_int>)
           (undefined4)current.super_BuildRecord.prims.super_PrimInfoMB.object_range._end;
      context_2.my_version =
           current.super_BuildRecord.prims.super_PrimInfoMB.object_range._end._4_1_;
      context_2.my_traits =
           (context_traits)current.super_BuildRecord.prims.super_PrimInfoMB.object_range._end._5_1_;
      context_2.my_state.super___atomic_base<unsigned_char>._M_i =
           (__atomic_base<unsigned_char>)
           (__atomic_base<unsigned_char>)
           current.super_BuildRecord.prims.super_PrimInfoMB.object_range._end._6_1_;
      context_2.my_lifetime_state._M_i =
           current.super_BuildRecord.prims.super_PrimInfoMB.object_range._end._7_1_;
      ::anon_func::anon_class_16_2_aeee9775::operator()
                ((LBBox3fa *)&left,(anon_class_16_2_aeee9775 *)&vSplitPos,
                 (range<unsigned_long> *)&context_2);
    }
    else {
      tbb::detail::d1::task_group_context::task_group_context
                (&context_2,(context_traits)0x4,CUSTOM_CTX);
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_ =
           current.super_BuildRecord.prims.super_PrimInfoMB.object_range._end;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._8_8_ =
           current.super_BuildRecord.prims.super_PrimInfoMB.object_range._begin;
      right.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0._0_8_ =
           0x400;
      isLeft.split = (Split *)&vSplitMask;
      isLeft.vSplitPos = &vSplitPos;
      tbb::detail::d1::
      parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::LBBox<embree::Vec3fa>,embree::parallel_reduce<unsigned_long,embree::LBBox<embree::Vec3fa>,embree::SetMB::linearBounds<embree::sse2::RecalculatePrimRef<embree::Instance>>(embree::sse2::RecalculatePrimRef<embree::Instance>const&)const::_lambda(embree::range<unsigned_long>const&)_1_,embree::SetMB::linearBounds<embree::sse2::RecalculatePrimRef<embree::Instance>>(embree::sse2::RecalculatePrimRef<embree::Instance>const&)const::_lambda(embree::LBBox<embree::Vec3fa>const&,embree::LBBox<embree::Vec3fa>const&)_1_>(unsigned_long,unsigned_long,unsigned_long,embree::LBBox<embree::Vec3fa>const&,embree::SetMB::linearBounds<embree::sse2::RecalculatePrimRef<embree::Instance>>(embree::sse2::RecalculatePrimRef<embree::Instance>const&)const::_lambda(embree::range<unsigned_long>const&)_1_const&,embree::SetMB::linearBounds<embree::sse2::RecalculatePrimRef<embree::Instance>>(embree::sse2::RecalculatePrimRef<embree::Instance>const&)const::_lambda(embree::LBBox<embree::Vec3fa>const&,embree::LBBox<embree::Vec3fa>const&)_1_const&)::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&,embree::LBBox<embree::Vec3fa>const&)_1_,embree::SetMB::linearBounds<embree::sse2::RecalculatePrimRef<embree::Instance>>(embree::sse2::RecalculatePrimRef<embree::Instance>const&)const::_lambda(embree::LBBox<embree::Vec3fa>const&,embree::LBBox<embree::Vec3fa>const&)_1_>
                ((LBBox<embree::Vec3fa> *)&left,(d1 *)&right,
                 (blocked_range<unsigned_long> *)&local_1a28,(LBBox<embree::Vec3fa> *)&isLeft,
                 (anon_class_16_2_ed117de8_conflict31 *)isLeft.split,
                 (anon_class_1_0_00000001 *)&context_2,local_1e18._0_8_);
      cVar16 = tbb::detail::r1::is_group_execution_cancelled(&context_2);
      if (cVar16 != '\0') {
        prVar22 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar22,"task cancelled");
        __cxa_throw(prVar22,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      tbb::detail::d1::task_group_context::~task_group_context(&context_2);
    }
    (__return_storage_ptr__->ref).ptr = local_1dd8;
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds0.lower.field_0 =
         left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds0.lower.field_0 + 8) =
         left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.lower.field_0._8_8_;
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds0.upper.field_0 =
         left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds0.upper.field_0 + 8) =
         left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds0.upper.field_0._8_8_;
    *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds1.lower.field_0 =
         left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds1.lower.field_0 + 8) =
         left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.lower.field_0._8_8_;
    uVar43 = left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.
             _0_8_;
    uVar45 = left.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.upper.field_0.
             _8_8_;
  }
  *(undefined8 *)&(__return_storage_ptr__->lbounds).bounds1.upper.field_0 = uVar43;
  *(undefined8 *)((long)&(__return_storage_ptr__->lbounds).bounds1.upper.field_0 + 8) = uVar45;
  BVar11.upper = current.super_BuildRecord.prims.super_PrimInfoMB.time_range.upper;
  BVar11.lower = current.super_BuildRecord.prims.super_PrimInfoMB.time_range.lower;
  __return_storage_ptr__->dt = BVar11;
  for (uVar35 = 0; uVar35 < children.numChildren; uVar35 = uVar35 + 1) {
    pSVar4 = children.primvecs.items[uVar35];
    psVar1 = &pSVar4->refCount;
    *psVar1 = *psVar1 - 1;
    if (*psVar1 == 0) {
      pvVar24 = pSVar4->prims;
      if (pvVar24 !=
          (vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
           *)0x0) {
        sVar25 = pvVar24->size_alloced;
        pPVar5 = pvVar24->items;
        if (pPVar5 != (PrimRefMB *)0x0) {
          if (sVar25 * 0x50 < 0x1c00000) {
            alignedFree(pPVar5);
          }
          else {
            os_free(pPVar5,sVar25 * 0x50,(pvVar24->alloc).hugepages);
          }
        }
        if (sVar25 != 0) {
          pMVar6 = (pvVar24->alloc).device;
          (**pMVar6->_vptr_MemoryMonitorInterface)(pMVar6,sVar25 * -0x50,1);
        }
        pvVar24->size_active = 0;
        pvVar24->size_alloced = 0;
        pvVar24->items = (PrimRefMB *)0x0;
      }
      ::operator_delete(pvVar24);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

const NodeRecordMB4D createLargeLeaf(const BuildRecord& in, Allocator alloc)
          {
            /* this should never occur but is a fatal error */
            if (in.depth > cfg.maxDepth)
              throw_RTCError(RTC_ERROR_UNKNOWN,"depth limit reached");

            /* replace already found split by fallback split */
            const BuildRecordSplit current(BuildRecord(in.prims,in.depth),findFallback(in.prims));

            /* special case when directly creating leaf without any splits that could shrink time_range */
            bool force_split = false;
            if (current.depth == 1 && current.size() > 0)
            {
              BBox1f c = empty;
              BBox1f p = current.prims.time_range;
              for (size_t i=current.prims.begin(); i<current.prims.end(); i++) {
                mvector<PrimRefMB>& prims = *current.prims.prims;
                c.extend(prims[i].time_range);
              }
              
              force_split = c.lower > p.lower || c.upper < p.upper;
            }
	    
            /* create leaf for few primitives */
            if (current.size() <= cfg.maxLeafSize && current.split.data < Split::SPLIT_ENFORCE && !force_split)
              return createLeaf(current,alloc);
	  
            /* fill all children by always splitting the largest one */
            bool hasTimeSplits = false;
            NodeRecordMB4D values[MAX_BRANCHING_FACTOR];
            LocalChildListSplit children(current);

            do {
              /* find best child with largest bounding box area */
              size_t bestChild = -1;
              size_t bestSize = 0;
              for (size_t i=0; i<children.size(); i++)
              {
                /* ignore leaves as they cannot get split */
                if (children[i].size() <= cfg.maxLeafSize && children[i].split.data < Split::SPLIT_ENFORCE && !force_split)
                  continue;

                force_split = false;
                
                /* remember child with largest size */
                if (children[i].size() > bestSize) {
                  bestSize = children[i].size();
                  bestChild = i;
                }
              }
              if (bestChild == -1) break;

              /* perform best found split */
              BuildRecordSplit& brecord = children[bestChild];
              BuildRecordSplit lrecord(current.depth+1);
              BuildRecordSplit rrecord(current.depth+1);
              std::unique_ptr<mvector<PrimRefMB>> new_vector = split(brecord.split,brecord.prims,lrecord.prims,rrecord.prims);
              hasTimeSplits |= new_vector != nullptr;

              /* find new splits */
              lrecord.split = findFallback(lrecord.prims);
              rrecord.split = findFallback(rrecord.prims);
              children.split(bestChild,lrecord,rrecord,std::move(new_vector));

            } while (children.size() < cfg.branchingFactor);

            /* detect time_ranges that have shrunken */
            for (size_t i=0; i<children.size(); i++) {
              const BBox1f c = children[i].prims.time_range;
              const BBox1f p = in.prims.time_range;
              hasTimeSplits |= c.lower > p.lower || c.upper < p.upper;
            }

            /* create node */
            auto node = createNode(children.children.data(),children.numChildren,alloc,hasTimeSplits);

            /* recurse into each child and perform reduction */
            LBBox3fa gbounds = empty;
            for (size_t i=0; i<children.size(); i++) {
              values[i] = createLargeLeaf(children[i],alloc);
              gbounds.extend(values[i].lbounds);
            }

            setNode(current,children.children.data(),node,values,children.numChildren);

            /* calculate geometry bounds of this node */
            if (hasTimeSplits)
              return NodeRecordMB4D(node,current.prims.linearBounds(recalculatePrimRef),current.prims.time_range);
            else
              return NodeRecordMB4D(node,gbounds,current.prims.time_range);
          }